

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O2

gba_ppu_t * init_ppu(_Bool enable_graphics)

{
  byte *pbVar1;
  uint8_t *puVar2;
  gba_ppu_t *pgVar3;
  long lVar4;
  
  pgVar3 = (gba_ppu_t *)calloc(1,0x3ecd4);
  pgVar3->enable_graphics = enable_graphics;
  for (lVar4 = 0x12c01; lVar4 != 0x12cf1; lVar4 = lVar4 + 1) {
    pbVar1 = (byte *)((long)(pgVar3->screen + -1) + 0x3bf + lVar4 * 2);
    *pbVar1 = *pbVar1 | 0x80;
    puVar2 = &pgVar3->screen[0][0x77].b + lVar4 * 2;
    *puVar2 = *puVar2 | 0x80;
    puVar2 = &pgVar3->screen[0][0xef].b + lVar4 * 2;
    *puVar2 = *puVar2 | 0x80;
    puVar2 = &pgVar3->screen[1][0x77].b + lVar4 * 2;
    *puVar2 = *puVar2 | 0x80;
  }
  for (lVar4 = 0x26162; lVar4 != 0x26252; lVar4 = lVar4 + 1) {
    *(undefined1 *)((long)(pgVar3->screen + -1) + 0x3be + lVar4) = 0;
    (&pgVar3->screen[0][0x77].g)[lVar4] = '\0';
    *(ushort *)((long)pgVar3 + lVar4 * 2 + -0x26342) = *(ushort *)pgVar3->pram | 0x8000;
  }
  (pgVar3->BG2PB).raw = 0;
  (pgVar3->BG2PC).raw = 0;
  (pgVar3->BG2PA).raw = 0x100;
  (pgVar3->BG3PB).raw = 0;
  (pgVar3->BG3PC).raw = 0;
  (pgVar3->BG3PA).raw = 0x100;
  return pgVar3;
}

Assistant:

gba_ppu_t* init_ppu(bool enable_graphics) {
    assert(sizeof(float) == sizeof(word));

    gba_ppu_t* ppu = malloc(sizeof(gba_ppu_t));
    memset(ppu, 0, sizeof(gba_ppu_t));

    ppu->enable_graphics = enable_graphics;

    for (int x = 0; x < GBA_SCREEN_X; x++) {
        ppu->bgbuf[0][x].transparent = true;
        ppu->bgbuf[1][x].transparent = true;
        ppu->bgbuf[2][x].transparent = true;
        ppu->bgbuf[3][x].transparent = true;
    }

    clear_obj(ppu);

    ppu->BG2PA.raw = 0x0100;
    ppu->BG2PB.raw = 0x0000;
    ppu->BG2PC.raw = 0x0000;
    ppu->BG2PA.raw = 0x0100;

    ppu->BG3PA.raw = 0x0100;
    ppu->BG3PB.raw = 0x0000;
    ppu->BG3PC.raw = 0x0000;
    ppu->BG3PA.raw = 0x0100;

    return ppu;
}